

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

sector_t * P_PointInSectorBuggy(double x,double y)

{
  int iVar1;
  subsector_t *ssec;
  node_t *node;
  double y_local;
  double x_local;
  
  if (numgamenodes == 0) {
    x_local = (double)gamesubsectors->sector;
  }
  else {
    ssec = (subsector_t *)(gamenodes + (long)numgamenodes + -1);
    do {
      iVar1 = R_PointOnSideSlow(x,y,(node_t *)ssec);
      ssec = (subsector_t *)(&ssec[1].polys)[iVar1];
    } while (((ulong)ssec & 1) == 0);
    x_local = *(double *)&((FPolyNode *)((long)ssec + -0x40))->field_0x3f;
  }
  return (sector_t *)x_local;
}

Assistant:

sector_t *P_PointInSectorBuggy(double x, double y)
{
	// single subsector is a special case
	if (numgamenodes == 0)
		return gamesubsectors->sector;

	node_t *node = gamenodes + numgamenodes - 1;

	do
	{
		// Use original buggy point-on-side test when spawning
		// things at level load so that the map spots in the
		// emerald key room of Hexen MAP01 are spawned on the
		// window ledge instead of the blocking floor in front
		// of it. Why do I consider it buggy? Because a point
		// that lies directly on a line should always be
		// considered as "in front" of the line. The orientation
		// of the line should be irrelevant.
		node = (node_t *)node->children[R_PointOnSideSlow(x, y, node)];
	} while (!((size_t)node & 1));

	subsector_t *ssec = (subsector_t *)((BYTE *)node - 1);
	return ssec->sector;
}